

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

void T1_Done_Blend(T1_Face face)

{
  uint uVar1;
  uint uVar2;
  FT_Memory memory_00;
  PS_Blend pPVar3;
  PS_DesignMapRec *pPVar4;
  PS_DesignMap dmap;
  FT_UInt n;
  FT_UInt num_axis;
  FT_UInt num_designs;
  PS_Blend blend;
  FT_Memory memory;
  T1_Face face_local;
  
  memory_00 = (face->root).memory;
  pPVar3 = face->blend;
  if (pPVar3 != (PS_Blend)0x0) {
    uVar1 = pPVar3->num_designs;
    uVar2 = pPVar3->num_axis;
    ft_mem_free(memory_00,pPVar3->design_pos[0]);
    pPVar3->design_pos[0] = (FT_Fixed *)0x0;
    for (dmap._4_4_ = 1; dmap._4_4_ < uVar1; dmap._4_4_ = dmap._4_4_ + 1) {
      pPVar3->design_pos[dmap._4_4_] = (FT_Fixed *)0x0;
    }
    ft_mem_free(memory_00,pPVar3->privates[1]);
    pPVar3->privates[1] = (PS_Private)0x0;
    ft_mem_free(memory_00,pPVar3->font_infos[1]);
    pPVar3->font_infos[1] = (PS_FontInfo)0x0;
    ft_mem_free(memory_00,pPVar3->bboxes[1]);
    pPVar3->bboxes[1] = (FT_BBox *)0x0;
    for (dmap._4_4_ = 0; dmap._4_4_ < uVar1; dmap._4_4_ = dmap._4_4_ + 1) {
      pPVar3->privates[dmap._4_4_] = (PS_Private)0x0;
      pPVar3->font_infos[dmap._4_4_] = (PS_FontInfo)0x0;
      pPVar3->bboxes[dmap._4_4_] = (FT_BBox *)0x0;
    }
    ft_mem_free(memory_00,pPVar3->weight_vector);
    pPVar3->weight_vector = (FT_Fixed *)0x0;
    pPVar3->default_weight_vector = (FT_Fixed *)0x0;
    for (dmap._4_4_ = 0; dmap._4_4_ < uVar2; dmap._4_4_ = dmap._4_4_ + 1) {
      ft_mem_free(memory_00,pPVar3->axis_names[dmap._4_4_]);
      pPVar3->axis_names[dmap._4_4_] = (FT_String *)0x0;
    }
    for (dmap._4_4_ = 0; dmap._4_4_ < uVar2; dmap._4_4_ = dmap._4_4_ + 1) {
      pPVar4 = pPVar3->design_map + dmap._4_4_;
      ft_mem_free(memory_00,pPVar4->design_points);
      pPVar4->design_points = (FT_Long *)0x0;
      pPVar4->num_points = '\0';
    }
    ft_mem_free(memory_00,face->blend);
    face->blend = (PS_Blend)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T1_Done_Blend( T1_Face  face )
  {
    FT_Memory  memory = face->root.memory;
    PS_Blend   blend  = face->blend;


    if ( blend )
    {
      FT_UInt  num_designs = blend->num_designs;
      FT_UInt  num_axis    = blend->num_axis;
      FT_UInt  n;


      /* release design pos table */
      FT_FREE( blend->design_pos[0] );
      for ( n = 1; n < num_designs; n++ )
        blend->design_pos[n] = NULL;

      /* release blend `private' and `font info' dictionaries */
      FT_FREE( blend->privates[1] );
      FT_FREE( blend->font_infos[1] );
      FT_FREE( blend->bboxes[1] );

      for ( n = 0; n < num_designs; n++ )
      {
        blend->privates  [n] = NULL;
        blend->font_infos[n] = NULL;
        blend->bboxes    [n] = NULL;
      }

      /* release weight vectors */
      FT_FREE( blend->weight_vector );
      blend->default_weight_vector = NULL;

      /* release axis names */
      for ( n = 0; n < num_axis; n++ )
        FT_FREE( blend->axis_names[n] );

      /* release design map */
      for ( n = 0; n < num_axis; n++ )
      {
        PS_DesignMap  dmap = blend->design_map + n;


        FT_FREE( dmap->design_points );
        dmap->num_points = 0;
      }

      FT_FREE( face->blend );
    }
  }